

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

compare_eq_result_container<QList<QMimeMagicRule>,_QMimeMagicRule> __thiscall
QList<QMimeMagicRule>::operator==(QList<QMimeMagicRule> *this,QList<QMimeMagicRule> *other)

{
  long lVar1;
  const_iterator __first1;
  const_iterator __first2;
  bool bVar2;
  
  lVar1 = (this->d).size;
  if (lVar1 != (other->d).size) {
    return false;
  }
  __first1.i = (this->d).ptr;
  __first2.i = (other->d).ptr;
  if (__first1.i != __first2.i) {
    bVar2 = std::
            __equal4<QList<QMimeMagicRule>::const_iterator,QList<QMimeMagicRule>::const_iterator>
                      (__first1,__first1.i + lVar1,__first2,__first2.i + lVar1);
    return bVar2;
  }
  return true;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }